

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

void __thiscall
GlobOpt::OptHoistInvariant
          (GlobOpt *this,Instr *instr,BasicBlock *block,Loop *loop,Value *dstVal,Value *src1Val,
          Value *src2Val,bool isNotTypeSpecConv,bool lossy,BailOutKind bailoutKind)

{
  undefined1 *puVar1;
  IRType IVar2;
  undefined2 valueType;
  long lVar3;
  Type this_00;
  ValueInfo *this_01;
  code *pcVar4;
  byte bVar5;
  bool bVar6;
  BailOutKind BVar7;
  ValueNumber valueNumber;
  RegOpnd *pRVar8;
  Loop *pLVar9;
  Value *pVVar10;
  StackSym *sym;
  Loop *sym_00;
  Instr *this_02;
  undefined4 *puVar11;
  RegOpnd *pRVar12;
  BasicBlock *pBVar13;
  BasicBlock *pBVar15;
  Loop *pLVar16;
  ValueInfo *invariantValueInfoToHoist;
  undefined7 extraout_var;
  byte bVar17;
  ValueInfo *pVVar18;
  ValueType *this_03;
  Opnd *this_04;
  BasicBlock *pBVar19;
  GlobOptBlockData *pGVar20;
  BOOLEAN BVar21;
  undefined1 local_e8 [8];
  Opnd *src2;
  GlobOpt *local_d8;
  BasicBlock **local_d0;
  BasicBlock *local_c8;
  Value *local_c0;
  BVSparse<Memory::JitArenaAllocator> local_b8;
  Opnd *local_88;
  Opnd *src1;
  Value *landingPadSrc1val;
  undefined1 local_70 [8];
  BasicBlock *block_local;
  Loop *loop_local;
  BasicBlock *local_58;
  BasicBlock *local_50;
  GlobOpt *local_48;
  BasicBlock *local_40;
  Instr *local_38;
  Instr *instr_local;
  ulong uVar14;
  
  pBVar13 = loop->landingPad;
  local_88 = instr->m_src1;
  local_70 = (undefined1  [8])block;
  block_local = (BasicBlock *)loop;
  local_48 = this;
  local_38 = instr;
  if (local_88 != (Opnd *)0x0) {
    OptHoistUpdateValueType(this,loop,instr,&local_88,src1Val);
    bVar6 = IR::Opnd::IsRegOpnd(local_88);
    if (bVar6) {
      pRVar8 = IR::Opnd::AsRegOpnd(local_88);
      pRVar8->field_0x18 = pRVar8->field_0x18 & 0xfe;
    }
    local_e8 = (undefined1  [8])local_38->m_src2;
    if (local_e8 != (undefined1  [8])0x0) {
      OptHoistUpdateValueType(local_48,(Loop *)block_local,local_38,(Opnd **)local_e8,src2Val);
      bVar6 = IR::Opnd::IsRegOpnd((Opnd *)local_e8);
      if (bVar6) {
        pRVar8 = IR::Opnd::AsRegOpnd((Opnd *)local_e8);
        pRVar8->field_0x18 = pRVar8->field_0x18 & 0xfe;
      }
    }
  }
  if (local_38->m_dst == (Opnd *)0x0) {
    pRVar8 = (RegOpnd *)0x0;
    pBVar19 = (BasicBlock *)src1Val;
    bVar17 = lossy;
  }
  else {
    local_50 = pBVar13;
    pRVar8 = IR::Opnd::AsRegOpnd(local_38->m_dst);
    if (pRVar8 == (RegOpnd *)0x0) {
      pRVar8 = (RegOpnd *)0x0;
      pBVar19 = (BasicBlock *)src1Val;
      pBVar13 = local_50;
      bVar17 = lossy;
    }
    else {
      if (local_38->m_opcode - 0x1d3 < 10) {
        lossy = lossy || (local_48->field_0xf7 & 2) == 0;
      }
      else if (local_38->m_opcode == FromVar) {
        sym = IR::RegOpnd::TryGetStackSym(local_38->m_src1);
        if ((local_38->field_0x38 & 0x10) == 0) {
          if ((sym != (StackSym *)0x0) && (bailoutKind != BailOutInvalid)) {
            local_58 = (BasicBlock *)dstVal;
            if ((sym->field_0x1a & 1) != 0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
              *puVar11 = 1;
              bVar6 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                                 ,0x3b26,"(!src1StackSym->IsTypeSpec())",
                                 "!src1StackSym->IsTypeSpec()");
              if (!bVar6) goto LAB_0043d6c1;
              *puVar11 = 0;
            }
            pGVar20 = &local_50->globOptData;
            src1 = (Opnd *)GlobOptBlockData::FindValue(pGVar20,&sym->super_Sym);
            if (src1Val->valueNumber != *(ValueNumber *)&src1->_vptr_Opnd) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
              *puVar11 = 1;
              bVar6 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                                 ,0x3b28,
                                 "(src1Val->GetValueNumber() == landingPadSrc1val->GetValueNumber())"
                                 ,"src1Val->GetValueNumber() == landingPadSrc1val->GetValueNumber()"
                                );
              if (!bVar6) goto LAB_0043d6c1;
              *puVar11 = 0;
            }
            lVar3 = *(long *)&src1->m_valueType;
            IVar2 = (pRVar8->super_Opnd).m_type;
            local_e8 = (undefined1  [8])&stack0xffffffffffffffc8;
            src2 = (Opnd *)&src1;
            local_d8 = local_48;
            local_d0 = &block_local;
            local_c8 = (BasicBlock *)local_70;
            local_c0 = (Value *)&bailoutKind;
            if (IVar2 == TyFloat64) {
              bVar6 = ValueType::IsNumber(&src1Val->valueInfo->super_ValueType);
              dstVal = (Value *)local_58;
              if (bVar6) {
                bVar6 = ValueType::IsNumber((ValueType *)(lVar3 + 8));
LAB_0043d6a1:
                dstVal = (Value *)local_58;
                if (bVar6 == false) {
LAB_0043d6a5:
                  OptHoistInvariant::anon_class_48_6_64df1e2e::operator()
                            ((anon_class_48_6_64df1e2e *)local_e8);
                  dstVal = (Value *)local_58;
                }
              }
            }
            else {
              dstVal = (Value *)local_58;
              if (IVar2 == TyInt32) {
                this_03 = &src1Val->valueInfo->super_ValueType;
                if (lossy) {
                  bVar6 = ValueType::IsPrimitive(this_03);
                  if ((((bVar6) ||
                       (bVar6 = GlobOptBlockData::IsTypeSpecialized
                                          ((GlobOptBlockData *)((long)local_70 + 0xd0),
                                           &sym->super_Sym), dstVal = (Value *)local_58, bVar6)) &&
                      (bVar6 = ValueType::IsPrimitive((ValueType *)(lVar3 + 8)),
                      dstVal = (Value *)local_58, !bVar6)) &&
                     (bVar6 = GlobOptBlockData::IsTypeSpecialized(pGVar20,&sym->super_Sym),
                     dstVal = (Value *)local_58, !bVar6)) {
                    bailoutKind = BailOutOnNotPrimitive;
                    goto LAB_0043d6a5;
                  }
                }
                else {
                  bVar6 = ValueType::IsInt(this_03);
                  dstVal = (Value *)local_58;
                  if (bVar6) {
                    bVar6 = ValueType::IsInt((ValueType *)(lVar3 + 8));
                    goto LAB_0043d6a1;
                  }
                }
              }
            }
          }
        }
        else {
          BVar7 = IR::Instr::GetBailOutKind(local_38);
          if ((BailOutExpectingInteger < BVar7) ||
             ((0x40004eU >> (BVar7 & BailOnDivResultNotInt) & 1) == 0)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar11 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0x3b20,
                               "(instrBailoutKind == IR::BailOutIntOnly || instrBailoutKind == IR::BailOutExpectingInteger || instrBailoutKind == IR::BailOutOnNotPrimitive || instrBailoutKind == IR::BailOutNumberOnly || instrBailoutKind == IR::BailOutPrimitiveButString)"
                               ,
                               "instrBailoutKind == IR::BailOutIntOnly || instrBailoutKind == IR::BailOutExpectingInteger || instrBailoutKind == IR::BailOutOnNotPrimitive || instrBailoutKind == IR::BailOutNumberOnly || instrBailoutKind == IR::BailOutPrimitiveButString"
                              );
            if (!bVar6) goto LAB_0043d6c1;
            *puVar11 = 0;
          }
        }
      }
      if ((BasicBlock *)dstVal == (BasicBlock *)0x0) {
        dstVal = NewGenericValue(local_48,(ValueType)0x9,&pRVar8->super_Opnd);
      }
      local_58 = (BasicBlock *)CONCAT71(local_58._1_7_,lossy);
      if (isNotTypeSpecConv) {
        bVar6 = false;
      }
      else {
        bVar6 = local_38->m_opcode != LdC_A_I4;
      }
      pLVar9 = (Loop *)pRVar8->m_sym;
      local_40 = (BasicBlock *)src1Val;
      if ((pLVar9->loopNumber & 0x10000) != 0) {
        pLVar9 = (Loop *)StackSym::GetVarEquivSym((StackSym *)pLVar9,local_48->func);
      }
      pVVar10 = GlobOptBlockData::FindValue
                          ((GlobOptBlockData *)
                           &block_local->tempNumberTracker[1].super_NumberTemp.super_TempTrackerBase
                            .tempTransferredSyms.alloc,(Sym *)pLVar9);
      if (pVVar10 == (Value *)0x0) {
        BVar21 = BVSparse<Memory::JitArenaAllocator>::Test
                           (block_local->noImplicitCallJsArrayHeadSegmentSymUses,
                            *(BVIndex *)&pLVar9->topFunc);
      }
      else {
        BVar21 = *(ValueNumber *)&((Sym *)&((BasicBlock *)dstVal)->next)->_vptr_Sym !=
                 pVVar10->valueNumber;
      }
      if ((bool)(BVar21 == '\0' & bVar6)) {
        pBVar19 = local_40;
        pBVar13 = local_50;
        bVar17 = (byte)local_58;
      }
      else {
        bVar6 = OptDstIsInvariant(local_48,pRVar8);
        bVar17 = (byte)local_58;
        pBVar19 = local_40;
        pBVar13 = local_50;
        if (!bVar6) {
          IR::Instr::UnlinkDst(local_38);
          if ((pRVar8->m_sym->field_0x1a & 1) == 0) {
            pRVar12 = IR::RegOpnd::New((pRVar8->super_Opnd).m_type,local_38->m_func);
            loop_local = (Loop *)pRVar12->m_sym;
            BVSparse<Memory::JitArenaAllocator>::Set
                      (((GlobOptBlockData *)((long)local_70 + 0xd0))->liveVarSyms,
                       *(BVIndex *)&loop_local->topFunc);
          }
          else {
            pLVar16 = (Loop *)StackSym::New(TyVar,local_38->m_func);
            IVar2 = pRVar8->m_sym->m_type;
            if (IVar2 == TyFloat64) {
              BVSparse<Memory::JitArenaAllocator>::Set
                        (((GlobOptBlockData *)((long)local_70 + 0xd0))->liveFloat64Syms,
                         *(BVIndex *)&pLVar16->topFunc);
              sym_00 = (Loop *)StackSym::GetFloat64EquivSym((StackSym *)pLVar16,local_38->m_func);
            }
            else {
              sym_00 = pLVar16;
              if (IVar2 == TyInt32) {
                if (bVar17 == 0) {
                  BVSparse<Memory::JitArenaAllocator>::Set
                            (((GlobOptBlockData *)((long)local_70 + 0xd0))->liveInt32Syms,
                             *(BVIndex *)&pLVar16->topFunc);
                }
                sym_00 = (Loop *)StackSym::GetInt32EquivSym((StackSym *)pLVar16,local_38->m_func);
              }
            }
            loop_local = pLVar16;
            pRVar12 = IR::RegOpnd::New((StackSym *)sym_00,sym_00->field_0x1c,local_38->m_func);
          }
          valueType = (pRVar8->super_Opnd).m_valueType;
          IR::Opnd::SetValueType(&pRVar12->super_Opnd,(ValueType)valueType);
          this_02 = IR::Instr::New(Ld_A,&pRVar8->super_Opnd,&pRVar12->super_Opnd,local_38->m_func);
          IR::Instr::SetByteCodeOffset(this_02,local_38);
          IR::Instr::SetDst(local_38,&pRVar12->super_Opnd);
          IR::Instr::InsertBefore(local_38,this_02);
          puVar1 = &pRVar8->m_sym->field_0x18;
          *(uint *)puVar1 = *(uint *)puVar1 | 0x80000;
          if (((local_38->m_src1 != (Opnd *)0x0) &&
              (bVar6 = IR::Opnd::IsImmediateOpnd(local_38->m_src1), bVar6)) &&
             ((local_38->m_opcode - 0x1e4 < 2 || (local_38->m_opcode == Ld_A)))) {
            StackSym::SetIsConst(pRVar12->m_sym);
          }
          pBVar19 = local_40;
          pBVar13 = local_50;
          pLVar16 = ((BasicBlock *)dstVal)->prev->loop;
          bVar17 = (byte)local_58;
          bVar5 = (byte)local_58;
          if (pLVar16 != (Loop *)0x0) {
            bVar5 = pLVar16 != pLVar9 | (byte)local_58;
          }
          if (bVar5 == 0) {
            SetSymStoreDirect(local_48,(ValueInfo *)((BasicBlock *)dstVal)->prev,(Sym *)loop_local);
          }
          GlobOptBlockData::InsertNewValue
                    ((GlobOptBlockData *)((long)local_70 + 0xd0),dstVal,&pRVar12->super_Opnd);
          pRVar8 = pRVar12;
        }
      }
    }
  }
  BasicBlock::UnlinkInstr((BasicBlock *)local_70,local_38);
  this_00 = block_local->couldRemoveNegZeroBailoutForDef[4].alloc;
  if (this_00 == (Type)0x0) {
    BasicBlock::InsertAfter(pBVar13,local_38);
  }
  else {
    IR::Instr::InsertBefore((Instr *)this_00,local_38);
  }
  MarkNonByteCodeUsed(local_38);
  if ((local_38->field_0x38 & 0x50) != 0) {
    if (block_local->couldRemoveNegZeroBailoutForDef == (BVSparse<Memory::JitArenaAllocator> *)0x0)
    {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar11 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x3bcd,"(loop->bailOutInfo)","loop->bailOutInfo");
      if (!bVar6) goto LAB_0043d6c1;
      *puVar11 = 0;
    }
    EnsureBailTarget(local_48,(Loop *)block_local);
    IR::Instr::ReplaceBailOutInfo
              (local_38,(BailOutInfo *)block_local->couldRemoveNegZeroBailoutForDef);
  }
  if (pRVar8 == (RegOpnd *)0x0) {
    return;
  }
  local_58 = (BasicBlock *)pRVar8->m_sym;
  local_50 = local_58;
  if (((local_58->field_0x1a & 1) != 0) &&
     (local_50 = (BasicBlock *)StackSym::GetVarEquivSym((StackSym *)local_58,(Func *)0x0),
     local_50 == (BasicBlock *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar11 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3be0,"(dstVarSym)","dstVarSym");
    if (!bVar6) goto LAB_0043d6c1;
    *puVar11 = 0;
    local_50 = (BasicBlock *)0x0;
  }
  if ((isNotTypeSpecConv) ||
     (bVar6 = GlobOptBlockData::IsLive
                        ((GlobOptBlockData *)
                         &block_local->tempNumberTracker[1].super_NumberTemp.super_TempTrackerBase.
                          tempTransferredSyms.alloc,(Sym *)local_50), !bVar6)) {
    if (bVar17 != 0) {
      if ((local_58->field_0x1a & 1) == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar11 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x3bed,"(dstSym->IsTypeSpec())","dstSym->IsTypeSpec()");
        if (!bVar6) goto LAB_0043d6c1;
        *puVar11 = 0;
      }
      if (local_58->field_0x1c == TyInt32) {
        return;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar11 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x3bee,"(dstSym->IsInt32())","dstSym->IsInt32()");
      if (bVar6) {
        *puVar11 = 0;
        return;
      }
      goto LAB_0043d6c1;
    }
    loop_local = (Loop *)CONCAT71(loop_local._1_7_,(BasicBlock *)dstVal == pBVar19);
    if ((BasicBlock *)dstVal == pBVar19) {
      this_04 = local_38->m_src1;
      if (this_04 == (Opnd *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar11 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x3bf8,"(instr->GetSrc1())","instr->GetSrc1()");
        if (!bVar6) goto LAB_0043d6c1;
        *puVar11 = 0;
        this_04 = local_38->m_src1;
      }
      bVar6 = IR::Opnd::IsRegOpnd(this_04);
      if (!bVar6) goto LAB_0043d2de;
      pRVar8 = IR::Opnd::AsRegOpnd(local_38->m_src1);
      pBVar13 = (BasicBlock *)pRVar8->m_sym;
      if (((pBVar13->field_0x1a & 1) != 0) &&
         (pBVar13 = (BasicBlock *)StackSym::GetVarEquivSym((StackSym *)pBVar13,(Func *)0x0),
         pBVar13 == (BasicBlock *)0x0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar11 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x3bff,"(src1Sym)","src1Sym");
        if (!bVar6) goto LAB_0043d6c1;
        *puVar11 = 0;
        pBVar13 = (BasicBlock *)0x0;
      }
      pBVar15 = (BasicBlock *)
                GlobOptBlockData::FindValue
                          ((GlobOptBlockData *)((long)local_70 + 0xd0),(Sym *)pBVar13);
      local_40 = (BasicBlock *)0x0;
      if (pBVar15 == pBVar19) {
        local_40 = pBVar13;
      }
    }
    else {
LAB_0043d2de:
      local_40 = (BasicBlock *)0x0;
    }
    if (local_38->m_opcode == ExtendArg_A) {
      if (local_38->m_src1 == (Opnd *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar11 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x3c0c,"(instr->GetSrc1())","instr->GetSrc1()");
        if (!bVar6) {
LAB_0043d6c1:
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar11 = 0;
      }
      pLVar9 = ((BasicBlock *)dstVal)->prev->loop;
      pLVar16 = (Loop *)IR::Opnd::GetStackSym(local_38->m_dst);
      if (pLVar9 != pLVar16) {
        local_40 = (BasicBlock *)Sym::AsStackSym((Sym *)((BasicBlock *)dstVal)->prev->loop);
        loop_local = (Loop *)CONCAT71(loop_local._1_7_,1);
      }
    }
    landingPadSrc1val._4_4_ = *(ValueNumber *)&((Sym *)&((BasicBlock *)dstVal)->next)->_vptr_Sym;
    valueNumber = 0;
    InvariantBlockBackwardIterator::InvariantBlockBackwardIterator
              ((InvariantBlockBackwardIterator *)local_e8,local_48,(BasicBlock *)local_70,
               (BasicBlock *)block_local->tempNumberTracker,(StackSym *)0x0,0,false);
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    landingPadSrc1val._0_4_ = 0;
    while (local_c8 != (BasicBlock *)src2) {
      pBVar13 = InvariantBlockBackwardIterator::Block((InvariantBlockBackwardIterator *)local_e8);
      pGVar20 = &pBVar13->globOptData;
      bVar6 = GlobOptBlockData::IsLive(pGVar20,(Sym *)local_50);
      if (bVar6) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar11 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x3c1d,"(!hoistBlockData.IsLive(dstVarSym))",
                           "!hoistBlockData.IsLive(dstVarSym)");
        if (!bVar6) goto LAB_0043d6c1;
        *puVar11 = 0;
      }
      GlobOptBlockData::MakeLive(pGVar20,(StackSym *)local_58,false);
      if ((char)loop_local == '\0') {
        pVVar10 = CopyValue(local_48,dstVal,landingPadSrc1val._4_4_);
      }
      else if (((local_40 == (BasicBlock *)0x0) ||
               (pVVar10 = GlobOptBlockData::FindValue(pGVar20,(Sym *)local_40),
               pVVar10 == (Value *)0x0)) || (pVVar10->valueNumber != landingPadSrc1val._4_4_)) {
        if (valueNumber == (ValueNumber)landingPadSrc1val) {
          valueNumber = NewValueNumber(local_48);
        }
        pVVar10 = CopyValue(local_48,dstVal,valueNumber);
      }
      GlobOptBlockData::SetValue(pGVar20,pVVar10,(Sym *)local_50);
      InvariantBlockBackwardIterator::MoveNext((InvariantBlockBackwardIterator *)local_e8);
    }
    goto LAB_0043d5df;
  }
  bVar6 = IR::Opnd::IsRegOpnd(local_38->m_src1);
  if (bVar6) {
    pRVar12 = IR::Opnd::AsRegOpnd(local_38->m_src1);
    pBVar13 = (BasicBlock *)pRVar12->m_sym;
    if (pBVar13 == local_58) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar11 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x3c44,"(srcSym != dstSym)","srcSym != dstSym");
      if (!bVar6) goto LAB_0043d6c1;
      *puVar11 = 0;
    }
    if ((pBVar13->field_0x1a & 1) != 0) {
      pBVar13 = (BasicBlock *)StackSym::GetVarEquivSym((StackSym *)pBVar13,(Func *)0x0);
    }
    if (pBVar13 != local_50) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar11 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x3c46,"(srcVarSym == dstVarSym)","srcVarSym == dstVarSym");
      if (!bVar6) goto LAB_0043d6c1;
      *puVar11 = 0;
    }
  }
  if ((local_58->field_0x1a & 1) == 0) {
LAB_0043d4cf:
    loop_local = (Loop *)((ulong)loop_local._4_4_ << 0x20);
LAB_0043d4d6:
    local_40 = (BasicBlock *)((ulong)local_40 & 0xffffffff00000000);
  }
  else {
    IVar2 = (pRVar8->super_Opnd).m_type;
    if (IVar2 == TyFloat64) {
      if ((local_38->field_0x38 & 0x10) == 0) goto LAB_0043d4cf;
      BVar7 = IR::Instr::GetBailOutKind(local_38);
      loop_local = (Loop *)CONCAT44(loop_local._4_4_,
                                    CONCAT31((int3)(BVar7 >> 8),BVar7 == BailOutNumberOnly));
      goto LAB_0043d4d6;
    }
    if ((IVar2 != TyInt32) || (bVar17 != 0)) goto LAB_0043d4cf;
    uVar14 = 0;
    loop_local = (Loop *)CONCAT44(loop_local._4_4_,1);
    if ((local_38->field_0x38 & 0x10) == 0) {
LAB_0043d0ea:
      local_40 = (BasicBlock *)CONCAT44(local_40._4_4_,(int)CONCAT71((int7)(uVar14 >> 8),1));
    }
    else {
      BVar7 = IR::Instr::GetBailOutKind(local_38);
      uVar14 = (ulong)BVar7;
      if (BVar7 == BailOutIntOnly) goto LAB_0043d0ea;
      BVar7 = IR::Instr::GetBailOutKind(local_38);
      uVar14 = (ulong)BVar7;
      if (BVar7 == BailOutExpectingInteger) goto LAB_0043d0ea;
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar11 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x3c54,
                         "(!instr->HasBailOutInfo() || instr->GetBailOutKind() == IR::BailOutIntOnly || instr->GetBailOutKind() == IR::BailOutExpectingInteger)"
                         ,
                         "!instr->HasBailOutInfo() || instr->GetBailOutKind() == IR::BailOutIntOnly || instr->GetBailOutKind() == IR::BailOutExpectingInteger"
                        );
      if (!bVar6) goto LAB_0043d6c1;
      *puVar11 = 0;
      local_40 = (BasicBlock *)CONCAT44(local_40._4_4_,(int)CONCAT71(extraout_var,1));
    }
  }
  InvariantBlockBackwardIterator::InvariantBlockBackwardIterator
            ((InvariantBlockBackwardIterator *)local_e8,local_48,(BasicBlock *)local_70,
             (BasicBlock *)block_local->tempNumberTracker,(StackSym *)local_50,
             *(ValueNumber *)&((Sym *)&((BasicBlock *)dstVal)->next)->_vptr_Sym,false);
  pVVar18 = (ValueInfo *)0x0;
  local_50 = (BasicBlock *)CONCAT44(local_50._4_4_,(uint)bVar17);
  invariantValueInfoToHoist = (ValueInfo *)0x0;
  while (local_c8 != (BasicBlock *)src2) {
    pBVar13 = InvariantBlockBackwardIterator::Block((InvariantBlockBackwardIterator *)local_e8);
    GlobOptBlockData::MakeLive(&pBVar13->globOptData,(StackSym *)local_58,SUB81(local_50,0));
    if ((char)loop_local != '\0') {
      pVVar10 = InvariantBlockBackwardIterator::InvariantSymValue
                          ((InvariantBlockBackwardIterator *)local_e8);
      this_01 = pVVar10->valueInfo;
      if (this_01 == pVVar18) {
        if (pVVar18 != invariantValueInfoToHoist) {
          HoistInvariantValueInfo(local_48,invariantValueInfoToHoist,pVVar10,pBVar13);
        }
      }
      else {
        if ((char)local_40 == '\0') {
          invariantValueInfoToHoist = ValueInfo::SpecializeToFloat64(this_01,local_48->alloc);
        }
        else {
          invariantValueInfoToHoist = ValueInfo::SpecializeToInt32(this_01,local_48->alloc,false);
          pBVar13 = (BasicBlock *)0x0;
        }
        ChangeValueInfo(local_48,pBVar13,pVVar10,invariantValueInfoToHoist,false,false);
        pVVar18 = this_01;
      }
    }
    InvariantBlockBackwardIterator::MoveNext((InvariantBlockBackwardIterator *)local_e8);
  }
LAB_0043d5df:
  BVSparse<Memory::JitArenaAllocator>::~BVSparse(&local_b8);
  return;
}

Assistant:

void
GlobOpt::OptHoistInvariant(
    IR::Instr *instr,
    BasicBlock *block,
    Loop *loop,
    Value *dstVal,
    Value *const src1Val,
    Value *const src2Val,
    bool isNotTypeSpecConv,
    bool lossy,
    IR::BailOutKind bailoutKind)
{
    BasicBlock *landingPad = loop->landingPad;

    IR::Opnd* src1 = instr->GetSrc1();
    if (src1)
    {
        // We are hoisting this instruction possibly past other uses, which might invalidate the last use info. Clear it.
        OptHoistUpdateValueType(loop, instr, &src1, src1Val);

        if (src1->IsRegOpnd())
        {
            src1->AsRegOpnd()->m_isTempLastUse = false;
        }

        IR::Opnd* src2 = instr->GetSrc2();
        if (src2)
        {
            OptHoistUpdateValueType(loop, instr, &src2, src2Val);

            if (src2->IsRegOpnd())
            {
                src2->AsRegOpnd()->m_isTempLastUse = false;
            }
        }
    }

    IR::RegOpnd *dst = instr->GetDst() ? instr->GetDst()->AsRegOpnd() : nullptr;
    if(dst)
    {
        switch (instr->m_opcode)
        {
        case Js::OpCode::CmEq_I4:
        case Js::OpCode::CmNeq_I4:
        case Js::OpCode::CmLt_I4:
        case Js::OpCode::CmLe_I4:
        case Js::OpCode::CmGt_I4:
        case Js::OpCode::CmGe_I4:
        case Js::OpCode::CmUnLt_I4:
        case Js::OpCode::CmUnLe_I4:
        case Js::OpCode::CmUnGt_I4:
        case Js::OpCode::CmUnGe_I4:
            // These operations are a special case. They generate a lossy int value, and the var sym is initialized using
            // Conv_Bool. A sym cannot be live only as a lossy int sym, the var needs to be live as well since the lossy int
            // sym cannot be used to convert to var. We don't know however, whether the Conv_Bool will be hoisted. The idea
            // currently is that the sym is only used on the path in which it is initialized inside the loop. So, don't
            // hoist any liveness info for the dst.
            if (!this->GetIsAsmJSFunc())
            {
                lossy = true;
            }
            break;

        case Js::OpCode::FromVar:
        {
            StackSym* src1StackSym = IR::RegOpnd::TryGetStackSym(instr->GetSrc1());

            if (instr->HasBailOutInfo())
            {
                IR::BailOutKind instrBailoutKind = instr->GetBailOutKind();
                Assert(instrBailoutKind == IR::BailOutIntOnly ||
                    instrBailoutKind == IR::BailOutExpectingInteger ||
                    instrBailoutKind == IR::BailOutOnNotPrimitive ||
                    instrBailoutKind == IR::BailOutNumberOnly ||
                    instrBailoutKind == IR::BailOutPrimitiveButString);
            }
            else if (src1StackSym && bailoutKind != IR::BailOutInvalid)
            {
                // We may be hoisting FromVar from a region where it didn't need a bailout (src1 had a definite value type) to a region
                // where it would. In such cases, the FromVar needs a bailout based on the value type of src1 in its new position.
                Assert(!src1StackSym->IsTypeSpec());
                Value* landingPadSrc1val = landingPad->globOptData.FindValue(src1StackSym);
                Assert(src1Val->GetValueNumber() == landingPadSrc1val->GetValueNumber());

                ValueInfo *src1ValueInfo = src1Val->GetValueInfo();
                ValueInfo *landingPadSrc1ValueInfo = landingPadSrc1val->GetValueInfo();
                IRType dstType = dst->GetType();

                const auto AddBailOutToFromVar = [&]()
                {
                    instr->GetSrc1()->SetValueType(landingPadSrc1val->GetValueInfo()->Type());
                    EnsureBailTarget(loop);
                    if (block->IsLandingPad())
                    {
                        instr = instr->ConvertToBailOutInstr(instr, bailoutKind, loop->bailOutInfo->bailOutOffset);
                    }
                    else
                    {
                        instr = instr->ConvertToBailOutInstr(instr, bailoutKind);
                    }
                };

                // A definite type in the source position and not a definite type in the destination (landing pad)
                // and no bailout on the instruction; we should put a bailout on the hoisted instruction.
                if (dstType == TyInt32)
                {
                    if (lossy)
                    {
                        if ((src1ValueInfo->IsPrimitive() || block->globOptData.IsTypeSpecialized(src1StackSym)) &&                // didn't need a lossy type spec bailout in the source block
                            (!landingPadSrc1ValueInfo->IsPrimitive() && !landingPad->globOptData.IsTypeSpecialized(src1StackSym))) // needs a lossy type spec bailout in the landing pad
                        {
                            bailoutKind = IR::BailOutOnNotPrimitive;
                            AddBailOutToFromVar();
                        }
                    }
                    else if (src1ValueInfo->IsInt() && !landingPadSrc1ValueInfo->IsInt())
                    {
                        AddBailOutToFromVar();
                    }
                }
                else if ((dstType == TyFloat64 && src1ValueInfo->IsNumber() && !landingPadSrc1ValueInfo->IsNumber()))
                {
                    AddBailOutToFromVar();
                }
            }

            break;
        }
        }

        if (dstVal == NULL)
        {
            dstVal = this->NewGenericValue(ValueType::Uninitialized, dst);
        }

        // ToVar/FromVar don't need a new dst because it has to be invariant if their src is invariant.
        bool dstDoesntNeedLoad = (!isNotTypeSpecConv && instr->m_opcode != Js::OpCode::LdC_A_I4);

        StackSym *varSym = dst->m_sym;

        if (varSym->IsTypeSpec())
        {
            varSym = varSym->GetVarEquivSym(this->func);
        }

        Value *const landingPadDstVal = loop->landingPad->globOptData.FindValue(varSym);
        if(landingPadDstVal
                ? dstVal->GetValueNumber() != landingPadDstVal->GetValueNumber()
                : loop->symsDefInLoop->Test(varSym->m_id))
        {
            // We need a temp for FromVar/ToVar if dst changes in the loop.
            dstDoesntNeedLoad = false;
        }

        if (!dstDoesntNeedLoad && this->OptDstIsInvariant(dst) == false)
        {
            // Keep dst in place, hoist instr using a new dst.
            instr->UnlinkDst();

            // Set type specialization info correctly for this new sym
            StackSym *copyVarSym;
            IR::RegOpnd *copyReg;
            if (dst->m_sym->IsTypeSpec())
            {
                copyVarSym = StackSym::New(TyVar, instr->m_func);
                StackSym *copySym = copyVarSym;
                if (dst->m_sym->IsInt32())
                {
                    if(lossy)
                    {
                        // The new sym would only be live as a lossy int since we're only hoisting the store to the int version
                        // of the sym, and cannot be converted to var. It is not legal to have a sym only live as a lossy int,
                        // so don't update liveness info for this sym.
                    }
                    else
                    {
                        block->globOptData.liveInt32Syms->Set(copyVarSym->m_id);
                    }
                    copySym = copySym->GetInt32EquivSym(instr->m_func);
                }
                else if (dst->m_sym->IsFloat64())
                {
                    block->globOptData.liveFloat64Syms->Set(copyVarSym->m_id);
                    copySym = copySym->GetFloat64EquivSym(instr->m_func);
                }
                copyReg = IR::RegOpnd::New(copySym, copySym->GetType(), instr->m_func);
            }
            else
            {
                copyReg = IR::RegOpnd::New(dst->GetType(), instr->m_func);
                copyVarSym = copyReg->m_sym;
                block->globOptData.liveVarSyms->Set(copyVarSym->m_id);
            }

            copyReg->SetValueType(dst->GetValueType());
            IR::Instr *copyInstr = IR::Instr::New(Js::OpCode::Ld_A, dst, copyReg, instr->m_func);
            copyInstr->SetByteCodeOffset(instr);
            instr->SetDst(copyReg);
            instr->InsertBefore(copyInstr);

            dst->m_sym->m_mayNotBeTempLastUse = true;

            if (instr->GetSrc1() && instr->GetSrc1()->IsImmediateOpnd())
            {
                // Propagate IsIntConst if appropriate
                switch(instr->m_opcode)
                {
                case Js::OpCode::Ld_A:
                case Js::OpCode::Ld_I4:
                case Js::OpCode::LdC_A_I4:
                    copyReg->m_sym->SetIsConst();
                    break;
                }
            }

            ValueInfo *dstValueInfo = dstVal->GetValueInfo();
            if((!dstValueInfo->GetSymStore() || dstValueInfo->GetSymStore() == varSym) && !lossy)
            {
                // The destination's value may have been transferred from one of the invariant sources, in which case we should
                // keep the sym store intact, as that sym will likely have a better lifetime than this new copy sym. For
                // instance, if we're inside a conditioned block, because we don't make the copy sym live and set its value in
                // all preceding blocks, this sym would not be live after exiting this block, causing this value to not
                // participate in copy-prop after this block.
                this->SetSymStoreDirect(dstValueInfo, copyVarSym);
            }

            block->globOptData.InsertNewValue(dstVal, copyReg);
            dst = copyReg;
        }
    }

    // Move to landing pad
    block->UnlinkInstr(instr);

    if (loop->bailOutInfo->bailOutInstr)
    {
        loop->bailOutInfo->bailOutInstr->InsertBefore(instr);
    }
    else
    {
        landingPad->InsertAfter(instr);
    }

    GlobOpt::MarkNonByteCodeUsed(instr);

    if (instr->HasBailOutInfo() || instr->HasAuxBailOut())
    {
        Assert(loop->bailOutInfo);
        EnsureBailTarget(loop);

        // Copy bailout info of loop top.
        instr->ReplaceBailOutInfo(loop->bailOutInfo);
    }

    if(!dst)
    {
        return;
    }

    // The bailout info's liveness for the dst sym is not updated in loop landing pads because bailout instructions previously
    // hoisted into the loop's landing pad may bail out before the current type of the dst sym became live (perhaps due to this
    // instruction). Since the landing pad will have a shared bailout point, the bailout info cannot assume that the current
    // type of the dst sym was live during every bailout hoisted into the landing pad.

    StackSym *const dstSym = dst->m_sym;
    StackSym *const dstVarSym = dstSym->IsTypeSpec() ? dstSym->GetVarEquivSym(nullptr) : dstSym;
    Assert(dstVarSym);
    if(isNotTypeSpecConv || !loop->landingPad->globOptData.IsLive(dstVarSym))
    {
        // A new dst is being hoisted, or the same single-def dst that would not be live before this block. So, make it live and
        // update the value info with the same value info in this block.

        if(lossy)
        {
            // This is a lossy conversion to int. The instruction was given a new dst specifically for hoisting, so this new dst
            // will not be live as a var before this block. A sym cannot be live only as a lossy int sym, the var needs to be
            // live as well since the lossy int sym cannot be used to convert to var. Since the var version of the sym is not
            // going to be initialized, don't hoist any liveness info for the dst. The sym is only going to be used on the path
            // in which it is initialized inside the loop.
            Assert(dstSym->IsTypeSpec());
            Assert(dstSym->IsInt32());
            return;
        }

        // Check if the dst value was transferred from the src. If so, the value transfer needs to be replicated.
        bool isTransfer = dstVal == src1Val;

        StackSym *transferValueOfSym = nullptr;
        if(isTransfer)
        {
            Assert(instr->GetSrc1());
            if(instr->GetSrc1()->IsRegOpnd())
            {
                StackSym *src1Sym = instr->GetSrc1()->AsRegOpnd()->m_sym;
                if(src1Sym->IsTypeSpec())
                {
                    src1Sym = src1Sym->GetVarEquivSym(nullptr);
                    Assert(src1Sym);
                }
                if(dstVal == block->globOptData.FindValue(src1Sym))
                {
                    transferValueOfSym = src1Sym;
                }
            }
        }

        // SIMD_JS
        if (instr->m_opcode == Js::OpCode::ExtendArg_A)
        {
            // Check if we should have CSE'ed this EA
            Assert(instr->GetSrc1());

            // If the dstVal symstore is not the dst itself, then we copied the Value from another expression.
            if (dstVal->GetValueInfo()->GetSymStore() != instr->GetDst()->GetStackSym())
            {
                isTransfer = true;
                transferValueOfSym = dstVal->GetValueInfo()->GetSymStore()->AsStackSym();
            }
        }

        const ValueNumber dstValueNumber = dstVal->GetValueNumber();
        ValueNumber dstNewValueNumber = InvalidValueNumber;
        for(InvariantBlockBackwardIterator it(this, block, loop->landingPad, nullptr); it.IsValid(); it.MoveNext())
        {
            BasicBlock *const hoistBlock = it.Block();
            GlobOptBlockData &hoistBlockData = hoistBlock->globOptData;

            Assert(!hoistBlockData.IsLive(dstVarSym));
            hoistBlockData.MakeLive(dstSym, lossy);

            Value *newDstValue;
            do
            {
                if(isTransfer)
                {
                    if(transferValueOfSym)
                    {
                        newDstValue = hoistBlockData.FindValue(transferValueOfSym);
                        if(newDstValue && newDstValue->GetValueNumber() == dstValueNumber)
                        {
                            break;
                        }
                    }

                    // It's a transfer, but we don't have a sym whose value number matches in the target block. Use a new value
                    // number since we don't know if there is already a value with the current number for the target block.
                    if(dstNewValueNumber == InvalidValueNumber)
                    {
                        dstNewValueNumber = NewValueNumber();
                    }
                    newDstValue = CopyValue(dstVal, dstNewValueNumber);
                    break;
                }

                newDstValue = CopyValue(dstVal, dstValueNumber);
            } while(false);

            hoistBlockData.SetValue(newDstValue, dstVarSym);
        }
        return;
    }

#if DBG
    if(instr->GetSrc1()->IsRegOpnd()) // Type spec conversion may load a constant into a dst sym
    {
        StackSym *const srcSym = instr->GetSrc1()->AsRegOpnd()->m_sym;
        Assert(srcSym != dstSym); // Type spec conversion must be changing the type, so the syms must be different
        StackSym *const srcVarSym = srcSym->IsTypeSpec() ? srcSym->GetVarEquivSym(nullptr) : srcSym;
        Assert(srcVarSym == dstVarSym); // Type spec conversion must be between variants of the same var sym
    }
#endif

    bool changeValueType = false, changeValueTypeToInt = false;
    if(dstSym->IsTypeSpec())
    {
        if(dst->IsInt32())
        {
            if(!lossy)
            {
                Assert(
                    !instr->HasBailOutInfo() ||
                    instr->GetBailOutKind() == IR::BailOutIntOnly ||
                    instr->GetBailOutKind() == IR::BailOutExpectingInteger);
                changeValueType = changeValueTypeToInt = true;
            }
        }
        else if (dst->IsFloat64())
        {
            if(instr->HasBailOutInfo() && instr->GetBailOutKind() == IR::BailOutNumberOnly)
            {
                changeValueType = true;
            }
        }
    }

    ValueInfo *previousValueInfoBeforeUpdate = nullptr, *previousValueInfoAfterUpdate = nullptr;
    for(InvariantBlockBackwardIterator it(
            this,
            block,
            loop->landingPad,
            dstVarSym,
            dstVal->GetValueNumber());
        it.IsValid();
        it.MoveNext())
    {
        BasicBlock *const hoistBlock = it.Block();
        GlobOptBlockData &hoistBlockData = hoistBlock->globOptData;

    #if DBG
        // TODO: There are some odd cases with field hoisting where the sym is invariant in only part of the loop and the info
        // does not flow through all blocks. Un-comment the verification below after PRE replaces field hoisting.

        //// Verify that the src sym is live as the required type, and that the conversion is valid
        //Assert(IsLive(dstVarSym, &hoistBlockData));
        //if(instr->GetSrc1()->IsRegOpnd())
        //{
        //    IR::RegOpnd *const src = instr->GetSrc1()->AsRegOpnd();
        //    StackSym *const srcSym = instr->GetSrc1()->AsRegOpnd()->m_sym;
        //    if(srcSym->IsTypeSpec())
        //    {
        //        if(src->IsInt32())
        //        {
        //            Assert(hoistBlockData.liveInt32Syms->Test(dstVarSym->m_id));
        //            Assert(!hoistBlockData.liveLossyInt32Syms->Test(dstVarSym->m_id)); // shouldn't try to convert a lossy int32 to anything
        //        }
        //        else
        //        {
        //            Assert(src->IsFloat64());
        //            Assert(hoistBlockData.liveFloat64Syms->Test(dstVarSym->m_id));
        //            if(dstSym->IsTypeSpec() && dst->IsInt32())
        //            {
        //                Assert(lossy); // shouldn't try to do a lossless conversion from float64 to int32
        //            }
        //        }
        //    }
        //    else
        //    {
        //        Assert(hoistBlockData.liveVarSyms->Test(dstVarSym->m_id));
        //    }
        //}
        //if(dstSym->IsTypeSpec() && dst->IsInt32())
        //{
        //    // If the sym is already specialized as required in the block to which we are attempting to hoist the conversion,
        //    // that info should have flowed into this block
        //    if(lossy)
        //    {
        //        Assert(!hoistBlockData.liveInt32Syms->Test(dstVarSym->m_id));
        //    }
        //    else
        //    {
        //        Assert(!IsInt32TypeSpecialized(dstVarSym, hoistBlock));
        //    }
        //}
    #endif

        hoistBlockData.MakeLive(dstSym, lossy);

        if(!changeValueType)
        {
            continue;
        }

        Value *const hoistBlockValue = it.InvariantSymValue();
        ValueInfo *const hoistBlockValueInfo = hoistBlockValue->GetValueInfo();
        if(hoistBlockValueInfo == previousValueInfoBeforeUpdate)
        {
            if(hoistBlockValueInfo != previousValueInfoAfterUpdate)
            {
                HoistInvariantValueInfo(previousValueInfoAfterUpdate, hoistBlockValue, hoistBlock);
            }
        }
        else
        {
            previousValueInfoBeforeUpdate = hoistBlockValueInfo;
            ValueInfo *const newValueInfo =
                changeValueTypeToInt
                    ? hoistBlockValueInfo->SpecializeToInt32(alloc)
                    : hoistBlockValueInfo->SpecializeToFloat64(alloc);
            previousValueInfoAfterUpdate = newValueInfo;
            ChangeValueInfo(changeValueTypeToInt ? nullptr : hoistBlock, hoistBlockValue, newValueInfo);
        }
    }
}